

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPoints(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  PointSetNode *pPVar1;
  Ref<embree::XML> *siglen;
  long *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *sig;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  EVP_PKEY_CTX *ctx;
  Node *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  undefined1 uVar2;
  Ref<embree::XML> normals;
  size_t i_5;
  Ref<embree::XML> animation_1;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::PointSetNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_fffffffffffff8f8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff900;
  string *in_stack_fffffffffffff930;
  XML *in_stack_fffffffffffff938;
  size_t in_stack_fffffffffffff980;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff988;
  RTCGeometryType in_stack_fffffffffffff994;
  PointSetNode *in_stack_fffffffffffff998;
  BBox1f in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9b8;
  XML *in_stack_fffffffffffff9c0;
  undefined7 in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9e7;
  XML *in_stack_fffffffffffff9e8;
  XML *this_00;
  Ref<embree::XML> *in_stack_fffffffffffffa90;
  Ref<embree::XML> *pRVar3;
  XMLLoader *in_stack_fffffffffffffa98;
  XMLLoader *this_01;
  Ref<embree::XML> *in_stack_fffffffffffffb10;
  XMLLoader *in_stack_fffffffffffffb18;
  Ref<embree::XML> *local_4d8;
  allocator local_4c9;
  string local_4c8 [32];
  long *local_4a8;
  long *local_4a0;
  EVP_PKEY_CTX local_498 [8];
  ulong local_490;
  undefined8 local_488;
  undefined8 local_480;
  Ref<embree::XML> *local_478;
  allocator<char> local_469;
  string local_468 [32];
  long *local_448;
  Ref<embree::XML> *in_stack_fffffffffffffbc0;
  XMLLoader *in_stack_fffffffffffffbc8;
  long *local_418;
  undefined1 local_410 [8];
  ulong local_408;
  undefined8 local_400;
  Ref<embree::XML> *local_3f8;
  long *local_3f0;
  undefined1 local_3e8 [8];
  ulong local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  Ref<embree::XML> *local_3c8;
  allocator local_3b9;
  string local_3b8 [32];
  XMLLoader *local_398;
  undefined1 local_389;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 uStack_37c;
  long *local_378;
  PointSetNode *local_370 [3];
  allocator local_351;
  string local_350 [32];
  long *local_330;
  long *local_328 [2];
  long *local_318;
  long *local_300;
  long *local_2f8;
  long *local_2f0;
  long *local_2e8;
  long **local_2d8;
  long **local_2d0;
  XMLLoader **local_2c8;
  EVP_PKEY_CTX *local_2c0;
  undefined1 *local_2b0;
  undefined1 *local_2a0;
  undefined1 *local_290;
  long **local_280;
  long **local_270;
  long **local_260;
  XMLLoader **local_250;
  long **local_240;
  long **local_230;
  long **local_220;
  undefined4 *local_210;
  undefined4 *local_208;
  undefined4 *local_200;
  long **local_1f8;
  long **local_1f0;
  XMLLoader **local_1e8;
  XMLLoader **local_1e0;
  long **local_1d8;
  long **local_1d0;
  long **local_1c8;
  long **local_1b8;
  PointSetNode *local_1a8;
  PointSetNode **local_1a0;
  PointSetNode **local_198;
  PointSetNode **local_190;
  PointSetNode **local_188;
  PointSetNode **local_180;
  PointSetNode **local_178;
  PointSetNode **local_170;
  PointSetNode *local_160;
  PointSetNode **local_150;
  XMLLoader *local_130;
  undefined1 *local_128;
  ulong local_110;
  EVP_PKEY_CTX *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  EVP_PKEY_CTX *local_f0;
  undefined1 *local_c0;
  ulong local_90;
  undefined1 *local_88;
  ulong local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 *local_20;
  
  local_318 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"material",&local_351);
  XML::child(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  loadMaterial(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  local_280 = &local_330;
  if (local_330 != (long *)0x0) {
    (**(code **)(*local_330 + 0x18))();
  }
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  pPVar1 = (PointSetNode *)::operator_new(0xb0);
  local_389 = 1;
  local_1d0 = &local_378;
  local_1d8 = local_328;
  local_378 = local_328[0];
  if (local_328[0] != (long *)0x0) {
    (**(code **)(*local_328[0] + 0x10))();
  }
  local_384 = 0;
  local_388 = 0x3f800000;
  local_200 = &local_380;
  local_208 = &local_384;
  local_210 = &local_388;
  local_380 = 0;
  uStack_37c = 0x3f800000;
  SceneGraph::PointSetNode::PointSetNode
            (in_stack_fffffffffffff998,in_stack_fffffffffffff994,in_stack_fffffffffffff988,
             in_stack_fffffffffffff9a0,in_stack_fffffffffffff980);
  local_389 = 0;
  local_1a0 = local_370;
  local_1a8 = pPVar1;
  local_370[0] = pPVar1;
  if (pPVar1 != (PointSetNode *)0x0) {
    (*(pPVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  local_1c8 = &local_378;
  if (local_378 != (long *)0x0) {
    (**(code **)(*local_378 + 0x18))();
  }
  local_2e8 = local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"animated_positions",&local_3b9);
  XML::childOpt(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  local_2c8 = &local_398;
  if (local_398 == (XMLLoader *)0x0) {
    local_180 = local_370;
    local_2f0 = local_318;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffbc8,"positions",(allocator *)&stack0xfffffffffffffbc7)
    ;
    XML::childOpt(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    loadVec3ffArray(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    local_290 = local_410;
    for (local_90 = 0; local_90 < local_408; local_90 = local_90 + 1) {
    }
    siglen = local_3f8;
    local_88 = local_290;
    local_20 = local_290;
    alignedFree(in_stack_fffffffffffff8f8);
    local_3f8 = (Ref<embree::XML> *)0x0;
    local_400 = 0;
    local_408 = 0;
    local_260 = &local_418;
    if (local_418 != (long *)0x0) {
      (**(code **)(*local_418 + 0x18))();
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbc7);
  }
  else {
    local_3c8 = (Ref<embree::XML> *)0x0;
    while( true ) {
      local_1e0 = &local_398;
      pRVar3 = local_3c8;
      this_01 = local_398;
      siglen = (Ref<embree::XML> *)XML::size((XML *)0x394b10);
      if (siglen <= pRVar3) break;
      local_178 = local_370;
      local_1e8 = &local_398;
      XML::child(in_stack_fffffffffffff9e8,
                 CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
      loadVec3ffArray(this_01,pRVar3);
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      local_2a0 = local_3e8;
      for (local_70 = 0; local_70 < local_3e0; local_70 = local_70 + 1) {
      }
      local_60 = local_3d8;
      local_58 = local_3d0;
      local_68 = local_2a0;
      local_50 = local_2a0;
      alignedFree(in_stack_fffffffffffff8f8);
      local_3d0 = 0;
      local_3d8 = 0;
      local_3e0 = 0;
      local_270 = &local_3f0;
      if (local_3f0 != (long *)0x0) {
        (**(code **)(*local_3f0 + 0x18))();
      }
      local_3c8 = (Ref<embree::XML> *)((long)&local_3c8->ptr + 1);
    }
  }
  local_250 = &local_398;
  if (local_398 != (XMLLoader *)0x0) {
    (**(code **)(*(long *)&(local_398->path).filename + 0x18))();
  }
  local_2f8 = local_318;
  ctx = (EVP_PKEY_CTX *)*local_318;
  this_00 = (XML *)&local_469;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"animated_normals",(allocator *)this_00);
  XML::childOpt(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  local_2d0 = &local_448;
  uVar2 = local_448 != (long *)0x0;
  if ((bool)uVar2) {
    local_478 = (Ref<embree::XML> *)0x0;
    while( true ) {
      pRVar3 = local_478;
      local_1f0 = &local_448;
      siglen = (Ref<embree::XML> *)XML::size((XML *)0x39551f);
      sig = extraout_RDX;
      if (siglen <= pRVar3) break;
      local_188 = local_370;
      local_1f8 = &local_448;
      XML::child(this_00,CONCAT17(uVar2,in_stack_fffffffffffff9e0));
      loadVec3faArray(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      ctx = local_498;
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
      local_2c0 = local_498;
      for (local_110 = 0; local_110 < local_490; local_110 = local_110 + 1) {
      }
      local_100 = local_488;
      local_f8 = local_480;
      local_108 = local_2c0;
      local_f0 = local_2c0;
      alignedFree(in_stack_fffffffffffff8f8);
      local_480 = 0;
      local_488 = 0;
      local_490 = 0;
      local_240 = &local_4a0;
      if (local_4a0 != (long *)0x0) {
        (**(code **)(*local_4a0 + 0x18))();
      }
      local_478 = (Ref<embree::XML> *)((long)&local_478->ptr + 1);
    }
  }
  else {
    local_300 = local_318;
    ctx = (EVP_PKEY_CTX *)*local_318;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"normals",&local_4c9);
    XML::childOpt(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    local_2d8 = &local_4a8;
    sig = extraout_RDX_00;
    if (local_4a8 != (long *)0x0) {
      local_190 = local_370;
      loadVec3faArray(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      ctx = (EVP_PKEY_CTX *)&stack0xfffffffffffffb10;
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back(in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
      local_2b0 = &stack0xfffffffffffffb10;
      for (local_130 = (XMLLoader *)0x0; local_130 < in_stack_fffffffffffffb18;
          local_130 = (XMLLoader *)&(local_130->path).filename.field_0x1) {
      }
      local_128 = local_2b0;
      local_c0 = local_2b0;
      alignedFree(in_stack_fffffffffffff8f8);
      siglen = local_4d8;
      sig = extraout_RDX_01;
    }
    local_230 = &local_4a8;
    if (local_4a8 != (long *)0x0) {
      (**(code **)(*local_4a8 + 0x18))();
      sig = extraout_RDX_02;
    }
  }
  local_220 = &local_448;
  if (local_448 != (long *)0x0) {
    (**(code **)(*local_448 + 0x18))();
    sig = extraout_RDX_03;
  }
  local_198 = local_370;
  SceneGraph::PointSetNode::verify(local_370[0],ctx,sig,(size_t)siglen,in_R8,in_R9);
  local_170 = local_370;
  local_160 = local_370[0];
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_370[0];
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_150 = local_370;
  if (local_370[0] != (PointSetNode *)0x0) {
    (*(local_370[0]->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_1b8 = local_328;
  if (local_328[0] != (long *)0x0) {
    (**(code **)(*local_328[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPoints(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }